

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  Gap *pGVar1;
  Error EVar2;
  Node *pNVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *this_00;
  void *data_00;
  bool bVar10;
  long lStack_80;
  void *local_68;
  size_t local_60;
  undefined8 local_58;
  ulong local_50;
  void *local_48;
  undefined1 *local_40;
  long local_38;
  
  EVar2 = 2;
  switch(size) {
  case 1:
    lStack_80 = 0;
    break;
  case 2:
    lStack_80 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_00114a49_caseD_3;
  case 4:
    lStack_80 = 2;
    break;
  case 8:
    lStack_80 = 3;
    break;
  default:
    if (size == 0x10) {
      lStack_80 = 4;
    }
    else if (size == 0x40) {
      lStack_80 = 6;
    }
    else {
      if (size != 0x20) {
        return 2;
      }
      lStack_80 = 5;
    }
  }
  local_58 = *(undefined8 *)(&this->field_0x18 + lStack_80 * 0x18);
  local_68 = data;
  pNVar3 = ZoneTree<asmjit::v1_14::ConstPool::Node>::
           get<void_const*,asmjit::v1_14::ConstPool::Compare>
                     ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)
                      (&this->field_0x8 + lStack_80 * 0x18),&local_68,(Compare *)&local_58);
  if (pNVar3 == (Node *)0x0) {
    local_40 = &this->field_0x8;
    sVar8 = 0xffffffffffffffff;
    for (lVar7 = lStack_80 + -6; lVar7 != 0; lVar7 = lVar7 + 1) {
      pGVar1 = this->_gaps[lStack_80];
      if (pGVar1 != (Gap *)0x0) {
        sVar8 = pGVar1->_offset;
        sVar5 = pGVar1->_size;
        this->_gaps[lStack_80] = pGVar1->_next;
        pGVar1->_next = this->_gapPool;
        this->_gapPool = pGVar1;
        if (sVar8 % size != 0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/constpool.cpp"
                     ,0x93,"Support::isAligned<size_t>(offset, size)");
        }
        sVar5 = sVar5 - size;
        if (sVar5 != 0) {
          ConstPool_addGap(this,sVar8,sVar5);
        }
      }
    }
    if (sVar8 == 0xffffffffffffffff) {
      sVar8 = this->_size;
      sVar5 = (-size & (size + sVar8) - 1) - sVar8;
      if (sVar5 != 0) {
        ConstPool_addGap(this,sVar8,sVar5);
        sVar8 = sVar5 + this->_size;
      }
      this->_size = sVar8 + size;
    }
    pNVar3 = Tree::_newNode(this->_zone,data,size,sVar8,false);
    if (pNVar3 == (Node *)0x0) {
      return 1;
    }
    local_68 = *(void **)(&this->field_0x18 + lStack_80 * 0x18);
    local_60 = sVar8;
    local_48 = data;
    ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
              ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)(&this->field_0x8 + lStack_80 * 0x18),
               pNVar3,(Compare *)&local_68);
    *(long *)(&this->field_0x10 + lStack_80 * 0x18) =
         *(long *)(&this->field_0x10 + lStack_80 * 0x18) + 1;
    uVar4 = this->_alignment;
    if (this->_alignment <= size) {
      uVar4 = size;
    }
    this->_alignment = uVar4;
    *dstOffset = local_60;
    lVar7 = 1;
    local_50 = size;
    while (4 < size) {
      bVar10 = lStack_80 == 0;
      lStack_80 = lStack_80 + -1;
      if (bVar10) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/constpool.cpp"
                   ,0xbd,"treeIndex != 0");
      }
      lVar9 = lVar7 * 2;
      size = size >> 1;
      this_00 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)(local_40 + lStack_80 * 0x18);
      sVar8 = local_60;
      data_00 = local_48;
      local_38 = lVar9;
      while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, lVar7 = local_38, bVar10) {
        local_58 = *(undefined8 *)(this_00 + 0x10);
        local_68 = data_00;
        pNVar3 = ZoneTree<asmjit::v1_14::ConstPool::Node>::
                 get<void_const*,asmjit::v1_14::ConstPool::Compare>
                           (this_00,&local_68,(Compare *)&local_58);
        if (pNVar3 == (Node *)0x0) {
          pNVar3 = Tree::_newNode(this->_zone,data_00,size,sVar8,true);
          local_68 = *(void **)(this_00 + 0x10);
          ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
                    (this_00,pNVar3,(Compare *)&local_68);
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
        }
        data_00 = (void *)((long)data_00 + size);
        sVar8 = sVar8 + size;
      }
    }
    uVar4 = this->_minItemSize;
    uVar6 = local_50;
    if (uVar4 < local_50) {
      uVar6 = uVar4;
    }
    if (uVar4 == 0) {
      uVar6 = local_50;
    }
    this->_minItemSize = uVar6;
  }
  else {
    *dstOffset = (ulong)*(uint *)(pNVar3 + 0x14);
  }
  EVar2 = 0;
switchD_00114a49_caseD_3:
  return EVar2;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 64)
    treeIndex = kIndex64;
  else if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (ASMJIT_UNLIKELY(!node))
    return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern. We stop at size 4,
  // it probably doesn't make sense to split constants down to 1 byte.
  size_t pCount = 1;
  size_t smallerSize = size;

  while (smallerSize > 4) {
    pCount <<= 1;
    smallerSize >>= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += smallerSize) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, smallerSize, offset + (i * smallerSize), true);
      _tree[treeIndex].insert(node);
    }
  }

  if (_minItemSize == 0)
    _minItemSize = size;
  else
    _minItemSize = Support::min(_minItemSize, size);

  return kErrorOk;
}